

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall higan::Acceptor::OnNewConnectionInternal(Acceptor *this)

{
  bool bVar1;
  int __args;
  undefined1 local_38 [4];
  int client_fd;
  InetAddress address;
  Acceptor *this_local;
  
  address._32_8_ = this;
  InetAddress::InetAddress((InetAddress *)local_38);
  __args = Socket::Accept(&this->listening_socket_,(InetAddress *)local_38);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->newconnection_callback_);
  if (bVar1) {
    std::function<void_(int,_const_higan::InetAddress_&)>::operator()
              (&this->newconnection_callback_,__args,(InetAddress *)local_38);
  }
  else {
    Socket::CloseFd(__args);
  }
  InetAddress::~InetAddress((InetAddress *)local_38);
  return;
}

Assistant:

void Acceptor::OnNewConnectionInternal()
{
	InetAddress address{};
	int client_fd = listening_socket_.Accept(&address);

	if (newconnection_callback_)
	{
		newconnection_callback_(client_fd, address);
	}
	else
	{
		Socket::CloseFd(client_fd);
	}
}